

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall re2::RE2::PossibleMatchRange(RE2 *this,string *min,string *max,int maxlen)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  StringPiece local_138;
  re2 local_128 [32];
  string local_108 [8];
  string dmax;
  string local_e8 [8];
  string dmin;
  int local_c4;
  string local_c0 [4];
  int i;
  string local_90 [32];
  string local_70 [8];
  string pmax;
  string local_50 [8];
  string pmin;
  int local_30;
  int n;
  int maxlen_local;
  string *max_local;
  string *min_local;
  RE2 *this_local;
  
  if (this->prog_ == (Prog *)0x0) {
    return false;
  }
  local_30 = std::__cxx11::string::size();
  if (maxlen < local_30) {
    local_30 = maxlen;
  }
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::substr((ulong)local_90,(ulong)&this->prefix_);
  std::__cxx11::string::operator=(local_50,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::substr((ulong)local_c0,(ulong)&this->prefix_);
  std::__cxx11::string::operator=(local_70,local_c0);
  std::__cxx11::string::~string(local_c0);
  if ((this->prefix_foldcase_ & 1U) != 0) {
    for (local_c4 = 0; local_c4 < local_30; local_c4 = local_c4 + 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
      if (('`' < *pcVar2) &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50), *pcVar2 < '{')) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
        *pcVar2 = *pcVar2 + -0x20;
      }
    }
  }
  std::__cxx11::string::string(local_e8);
  std::__cxx11::string::string(local_108);
  if ((maxlen - local_30 < 1) ||
     (bVar1 = Prog::PossibleMatchRange
                        (this->prog_,(string *)local_e8,(string *)local_108,maxlen - local_30),
     !bVar1)) {
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) {
      std::__cxx11::string::operator=((string *)min,"");
      std::__cxx11::string::operator=((string *)max,"");
      this_local._7_1_ = false;
      goto LAB_00171a30;
    }
    StringPiece::StringPiece(&local_138,(string *)local_70);
    PrefixSuccessor_abi_cxx11_(local_128,&local_138);
    std::__cxx11::string::operator=(local_70,(string *)local_128);
    std::__cxx11::string::~string((string *)local_128);
  }
  else {
    std::__cxx11::string::operator+=(local_50,local_e8);
    std::__cxx11::string::operator+=(local_70,local_108);
  }
  std::__cxx11::string::operator=((string *)min,local_50);
  std::__cxx11::string::operator=((string *)max,local_70);
  this_local._7_1_ = true;
LAB_00171a30:
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return this_local._7_1_;
}

Assistant:

bool RE2::PossibleMatchRange(string* min, string* max, int maxlen) const {
  if (prog_ == NULL)
    return false;

  int n = static_cast<int>(prefix_.size());
  if (n > maxlen)
    n = maxlen;

  // Determine initial min max from prefix_ literal.
  string pmin, pmax;
  pmin = prefix_.substr(0, n);
  pmax = prefix_.substr(0, n);
  if (prefix_foldcase_) {
    // prefix is ASCII lowercase; change pmin to uppercase.
    for (int i = 0; i < n; i++) {
      if ('a' <= pmin[i] && pmin[i] <= 'z')
        pmin[i] += 'A' - 'a';
    }
  }

  // Add to prefix min max using PossibleMatchRange on regexp.
  string dmin, dmax;
  maxlen -= n;
  if (maxlen > 0 && prog_->PossibleMatchRange(&dmin, &dmax, maxlen)) {
    pmin += dmin;
    pmax += dmax;
  } else if (pmax.size() > 0) {
    // prog_->PossibleMatchRange has failed us,
    // but we still have useful information from prefix_.
    // Round up pmax to allow any possible suffix.
    pmax = PrefixSuccessor(pmax);
  } else {
    // Nothing useful.
    *min = "";
    *max = "";
    return false;
  }

  *min = pmin;
  *max = pmax;
  return true;
}